

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextVkImpl::Begin(DeviceContextVkImpl *this,Uint32 ImmediateContextId)

{
  bool bVar1;
  char (*in_RCX) [46];
  SoftwareQueueIndex CommandQueueId;
  string msg;
  SoftwareQueueIndex local_39;
  string local_38;
  
  if ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Desc.IsDeferred == false) {
    FormatString<char[53]>
              (&local_38,(char (*) [53])"Begin() should only be called for deferred contexts.");
    in_RCX = (char (*) [46])0xce;
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"Begin",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xce);
    std::__cxx11::string::~string((string *)&local_38);
  }
  bVar1 = DeviceContextBase<Diligent::EngineVkImplTraits>::IsRecordingDeferredCommands
                    ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this);
  if (bVar1) {
    FormatString<char[101]>
              (&local_38,
               (char (*) [101])
               "This context is already recording commands. Call FinishCommandList() before beginning new recording."
              );
    in_RCX = (char (*) [46])0xcf;
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"Begin",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xcf);
    std::__cxx11::string::~string((string *)&local_38);
  }
  IndexWrapper<unsigned_char,Diligent::_SoftwareQueueIndexTag>::
  IndexWrapper<unsigned_int,unsigned_int>
            ((IndexWrapper<unsigned_char,Diligent::_SoftwareQueueIndexTag> *)&local_39,
             ImmediateContextId);
  PrepareCommandPool(this,local_39);
  (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
  super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_DstImmediateContextId.m_Value =
       (uchar)ImmediateContextId;
  if (0xff < ImmediateContextId) {
    FormatString<char[26],char[46]>
              (&local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_DstImmediateContextId == ImmediateContextId",in_RCX);
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"Begin",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xd3);
    std::__cxx11::string::~string((string *)&local_38);
  }
  this->m_pQueryMgr =
       (QueryManagerVk *)
       (((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
         super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice.m_pObject)->m_QueryMgrs).
       super__Vector_base<std::unique_ptr<Diligent::QueryManagerVk,_std::default_delete<Diligent::QueryManagerVk>_>,_std::allocator<std::unique_ptr<Diligent::QueryManagerVk,_std::default_delete<Diligent::QueryManagerVk>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[local_39.m_Value]._M_t.
       super___uniq_ptr_impl<Diligent::QueryManagerVk,_std::default_delete<Diligent::QueryManagerVk>_>
       ._M_t;
  return;
}

Assistant:

void DeviceContextVkImpl::Begin(Uint32 ImmediateContextId)
{
    DEV_CHECK_ERR(IsDeferred(), "Begin() should only be called for deferred contexts.");
    DEV_CHECK_ERR(!IsRecordingDeferredCommands(), "This context is already recording commands. Call FinishCommandList() before beginning new recording.");
    const SoftwareQueueIndex CommandQueueId{ImmediateContextId};
    PrepareCommandPool(CommandQueueId);
    m_DstImmediateContextId = static_cast<Uint8>(ImmediateContextId);
    VERIFY_EXPR(m_DstImmediateContextId == ImmediateContextId);
    m_pQueryMgr = &m_pDevice->GetQueryMgr(CommandQueueId);
}